

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int explist1(LexState *ls,expdesc *v)

{
  int iVar1;
  int iVar2;
  
  subexpr(ls,v,0);
  iVar1 = testnext(ls,0x2c);
  iVar2 = 1;
  while (iVar1 != 0) {
    luaK_exp2nextreg(ls->fs,v);
    subexpr(ls,v,0);
    iVar2 = iVar2 + 1;
    iVar1 = testnext(ls,0x2c);
  }
  return iVar2;
}

Assistant:

static int explist1(LexState*ls,expdesc*v){
int n=1;
expr(ls,v);
while(testnext(ls,',')){
luaK_exp2nextreg(ls->fs,v);
expr(ls,v);
n++;
}
return n;
}